

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

bool __thiscall DiskTableNode::intersect(DiskTableNode *this,DiskTableNode *rhs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  SSTableHeader *pSVar5;
  SSTableHeader *pSVar6;
  
  pSVar5 = SSTable::getHeader(this->_sstable);
  pSVar6 = SSTable::getHeader(rhs->_sstable);
  lVar1 = pSVar6->key_min;
  lVar2 = pSVar5->key_min;
  if (((lVar1 < lVar2) || (bVar4 = true, pSVar5->key_max < lVar1)) &&
     ((lVar3 = pSVar6->key_max, lVar3 < lVar2 || (bVar4 = true, pSVar5->key_max < lVar3)))) {
    if (lVar2 < lVar1) {
      bVar4 = false;
    }
    else {
      bVar4 = pSVar5->key_max <= lVar3;
    }
  }
  return bVar4;
}

Assistant:

bool DiskTableNode::intersect(DiskTableNode &rhs) {
    auto *h = getHeader();
    auto *rh = rhs.getHeader();
    return ((rh->key_min >= h->key_min && rh->key_min <= h->key_max) ||
            (rh->key_max >= h->key_min && rh->key_max <= h->key_max)) ||
           (h->key_min >= rh->key_min && h->key_max <= rh->key_max);
}